

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::pack_B_tile(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void **ppvVar1;
  undefined8 *puVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  int iVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int *piVar19;
  size_t sVar20;
  undefined8 uVar21;
  Allocator *pAVar22;
  Mat *pMVar23;
  size_t *psVar24;
  long lVar25;
  undefined8 *puVar26;
  void *pvVar27;
  long lVar28;
  undefined1 (*pauVar29) [32];
  long lVar30;
  undefined1 (*pauVar31) [16];
  Mat *pMVar32;
  long lVar33;
  uint uVar34;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  uint uVar45;
  int iVar46;
  long lVar47;
  long lVar48;
  ulong uVar49;
  int iVar50;
  long lVar51;
  undefined1 (*pauVar52) [16];
  long lVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  long lVar57;
  long lVar58;
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  long local_158;
  long local_138;
  long local_130;
  long local_110;
  long local_108;
  long local_100;
  long local_f8;
  long local_f0;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b0;
  
  iVar40 = B->elempack;
  psVar24 = (size_t *)&B->w;
  if (B->dims == 3) {
    psVar24 = &B->cstep;
  }
  iVar9 = (int)*psVar24;
  lVar48 = 0;
  lVar55 = (long)k;
  lVar36 = (long)j;
  lVar38 = (long)iVar9;
  if (0xb < max_jj) {
    lVar25 = (long)(k * 4) * 4;
    lVar56 = lVar25 + lVar38 * lVar36 * 4;
    lVar41 = (lVar36 + 4) * lVar38;
    lVar54 = lVar25 + lVar41 * 4;
    lVar47 = (lVar36 + 8) * lVar38;
    lVar25 = lVar25 + lVar47 * 4;
    lVar44 = lVar55 * 4;
    lVar28 = lVar44 + lVar38 * lVar36 * 4;
    lVar53 = lVar38 * 0x30;
    lVar30 = lVar38 * 4;
    local_f0 = 0;
    lVar33 = 0;
    do {
      iVar46 = (int)lVar33;
      if (iVar40 == 0x10) {
        pvVar27 = B->data;
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 0xf + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        uVar45 = uVar45 & 0xfffffff0;
        puVar26 = (undefined8 *)
                  ((long)pvVar27 + (long)(k << 4) * 4 + (long)(int)(uVar45 * iVar9) * 4);
        iVar35 = uVar34 - uVar45;
        iVar50 = max_kk;
        if (uVar34 == uVar45 && 0 < max_kk) {
          do {
            piVar19 = (int *)puVar26[1];
            sVar20 = puVar26[2];
            uVar21 = puVar26[3];
            BT->data = (void *)*puVar26;
            BT->refcount = piVar19;
            BT->elemsize = sVar20;
            *(undefined8 *)&BT->elempack = uVar21;
            *(undefined1 (*) [16])&BT->allocator = *(undefined1 (*) [16])(puVar26 + 4);
            BT = (Mat *)&BT->h;
            puVar26 = puVar26 + 8;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar50 = max_kk;
        if (iVar35 == 4 && 0 < max_kk) {
          do {
            piVar19 = (int *)puVar26[3];
            sVar20 = puVar26[4];
            uVar21 = puVar26[5];
            BT->data = (void *)puVar26[2];
            BT->refcount = piVar19;
            BT->elemsize = sVar20;
            *(undefined8 *)&BT->elempack = uVar21;
            *(undefined1 (*) [16])&BT->allocator = *(undefined1 (*) [16])(puVar26 + 6);
            BT = (Mat *)&BT->h;
            puVar26 = puVar26 + 8;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        pauVar31 = (undefined1 (*) [16])
                   ((long)pvVar27 + (long)(k << 4) * 4 + (long)(int)((uVar45 + 0x10) * iVar9) * 4);
        iVar50 = max_kk;
        if (iVar35 == 8 && 0 < max_kk) {
          do {
            piVar19 = (int *)puVar26[5];
            sVar20 = puVar26[6];
            uVar21 = puVar26[7];
            BT->data = (void *)puVar26[4];
            BT->refcount = piVar19;
            BT->elemsize = sVar20;
            *(undefined8 *)&BT->elempack = uVar21;
            *(undefined1 (*) [16])&BT->allocator = *pauVar31;
            BT = (Mat *)&BT->h;
            puVar26 = puVar26 + 8;
            pauVar31 = pauVar31 + 4;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        if (iVar35 == 0xc && 0 < max_kk) {
          lVar48 = 0;
          iVar50 = max_kk;
          do {
            puVar2 = (undefined8 *)((long)puVar26 + lVar48 + 0x30);
            piVar19 = (int *)puVar2[1];
            BT->data = (void *)*puVar2;
            BT->refcount = piVar19;
            *(undefined1 (*) [32])&BT->elemsize = *(undefined1 (*) [32])(*pauVar31 + lVar48);
            BT = (Mat *)&BT->h;
            lVar48 = lVar48 + 0x40;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
      }
      if (iVar40 == 8) {
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 7 + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        uVar45 = uVar45 & 0xfffffff8;
        puVar26 = (undefined8 *)
                  ((long)B->data + (long)(k * 8) * 4 + (long)(int)(uVar45 * iVar9) * 4);
        pauVar31 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(int)((uVar45 + 8) * iVar9) * 4);
        iVar46 = max_kk;
        if (uVar34 == uVar45 && 0 < max_kk) {
          do {
            piVar19 = (int *)puVar26[1];
            sVar20 = puVar26[2];
            uVar21 = puVar26[3];
            BT->data = (void *)*puVar26;
            BT->refcount = piVar19;
            BT->elemsize = sVar20;
            *(undefined8 *)&BT->elempack = uVar21;
            *(undefined1 (*) [16])&BT->allocator = *pauVar31;
            BT = (Mat *)&BT->h;
            puVar26 = puVar26 + 4;
            pauVar31 = pauVar31 + 2;
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
        }
        if (uVar34 - uVar45 == 4 && 0 < max_kk) {
          lVar48 = 0;
          iVar46 = max_kk;
          do {
            puVar2 = (undefined8 *)((long)puVar26 + lVar48 + 0x10);
            piVar19 = (int *)puVar2[1];
            BT->data = (void *)*puVar2;
            BT->refcount = piVar19;
            *(undefined1 (*) [32])&BT->elemsize = *(undefined1 (*) [32])(*pauVar31 + lVar48);
            BT = (Mat *)&BT->h;
            lVar48 = lVar48 + 0x20;
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
        }
      }
      if (iVar40 == 4) {
        if (0 < max_kk) {
          pvVar27 = B->data;
          iVar46 = max_kk;
          do {
            piVar19 = (int *)((undefined8 *)((long)pvVar27 + lVar56))[1];
            BT->data = *(void **)((long)pvVar27 + lVar56);
            BT->refcount = piVar19;
            sVar20 = ((size_t *)((long)pvVar27 + lVar54))[1];
            BT->elemsize = *(size_t *)((long)pvVar27 + lVar54);
            *(size_t *)&BT->elempack = sVar20;
            *(undefined1 (*) [16])&BT->allocator = *(undefined1 (*) [16])((long)pvVar27 + lVar25);
            BT = (Mat *)&BT->h;
            pvVar27 = (void *)((long)pvVar27 + 0x10);
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
          goto LAB_004ac2b8;
        }
      }
      else {
LAB_004ac2b8:
        if (iVar40 == 1) {
          pvVar27 = B->data;
          if (max_kk < 8) {
            uVar45 = 0;
            local_d8 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36) * lVar38 * 4;
            lVar48 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 1) * lVar38 * 4;
            lVar43 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 2) * lVar38 * 4;
            lVar42 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 3) * lVar38 * 4;
            lVar39 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 4) * lVar38 * 4;
            local_108 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 5) * lVar38 * 4;
            local_110 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 6) * lVar38 * 4;
            local_e0 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 7) * lVar38 * 4;
            lVar57 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 8) * lVar38 * 4;
            lVar58 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 9) * lVar38 * 4;
            local_158 = (long)pvVar27 + lVar55 * 4 + (lVar33 + lVar36 + 10) * lVar38 * 4;
            lVar37 = (long)pvVar27 + lVar55 * 4 + (lVar36 + lVar33 + 0xb) * lVar38 * 4;
          }
          else {
            lVar37 = (long)pvVar27 + local_f0;
            iVar46 = 7;
            do {
              lVar48 = lVar37 + lVar28;
              lVar43 = lVar48 + lVar38 * 8;
              auVar3 = *(undefined1 (*) [32])(lVar48 + lVar38 * 4);
              auVar62 = *(undefined1 (*) [32])(lVar48 + lVar38 * 8);
              auVar64 = *(undefined1 (*) [32])(lVar43 + lVar38 * 4);
              lVar42 = lVar38 * 8 + lVar43;
              auVar4 = *(undefined1 (*) [32])(lVar43 + lVar38 * 8);
              lVar48 = lVar42 + lVar38 * 4;
              auVar5 = *(undefined1 (*) [32])(lVar42 + lVar38 * 4);
              auVar66 = *(undefined1 (*) [32])(lVar30 + lVar48);
              lVar48 = lVar48 + lVar30;
              auVar6 = *(undefined1 (*) [32])(lVar30 + lVar48);
              lVar48 = lVar48 + lVar30;
              auVar7 = *(undefined1 (*) [32])(lVar30 + lVar48);
              lVar48 = lVar48 + lVar30;
              auVar8 = *(undefined1 (*) [32])(lVar30 + lVar48);
              lVar48 = lVar48 + lVar30;
              auVar68 = *(undefined1 (*) [32])(lVar30 + lVar48);
              auVar69 = *(undefined1 (*) [32])(lVar48 + lVar38 * 8);
              auVar71 = vunpcklps_avx(*(undefined1 (*) [32])(lVar37 + lVar28),auVar3);
              auVar70 = vunpckhps_avx(*(undefined1 (*) [32])(lVar37 + lVar28),auVar3);
              auVar3 = vunpcklps_avx(auVar62,auVar64);
              auVar62 = vunpckhps_avx(auVar62,auVar64);
              auVar64 = vunpcklps_avx(auVar4,auVar5);
              auVar4 = vunpckhps_avx(auVar4,auVar5);
              auVar59 = vunpcklps_avx(auVar66,auVar6);
              auVar5 = vunpckhps_avx(auVar66,auVar6);
              auVar60 = vunpcklps_avx(auVar7,auVar8);
              auVar66 = vunpckhps_avx(auVar7,auVar8);
              auVar73 = vunpcklps_avx(auVar68,auVar69);
              auVar6 = vunpckhps_avx(auVar68,auVar69);
              auVar7 = vunpcklpd_avx(auVar71,auVar3);
              auVar3 = vunpckhpd_avx(auVar71,auVar3);
              auVar8 = vunpcklpd_avx(auVar70,auVar62);
              auVar62 = vunpckhpd_avx(auVar70,auVar62);
              auVar68 = vunpcklpd_avx(auVar64,auVar59);
              auVar64 = vunpckhpd_avx(auVar64,auVar59);
              auVar69 = vunpcklpd_avx(auVar4,auVar5);
              auVar4 = vunpckhpd_avx(auVar4,auVar5);
              auVar70 = vunpcklpd_avx(auVar60,auVar73);
              auVar5 = vunpckhpd_avx(auVar60,auVar73);
              auVar71 = vunpcklpd_avx(auVar66,auVar6);
              auVar66 = vunpckhpd_avx(auVar66,auVar6);
              auVar63 = auVar68._0_16_;
              auVar67 = auVar70._0_16_;
              auVar61 = auVar3._0_16_;
              auVar73._16_16_ = auVar5._0_16_;
              auVar73._0_16_ = auVar64._0_16_;
              auVar72 = auVar8._0_16_;
              auVar65 = auVar69._0_16_;
              auVar59 = vinsertf32x4_avx512vl(auVar71,auVar62._0_16_,1);
              auVar60 = vinsertf32x4_avx512vl(auVar4,auVar66._0_16_,1);
              auVar6 = vperm2f128_avx(auVar7,auVar68,0x31);
              auVar3 = vperm2f128_avx(auVar70,auVar3,0x31);
              auVar64 = vperm2f128_avx(auVar64,auVar5,0x31);
              auVar5 = vperm2f128_avx(auVar8,auVar69,0x31);
              auVar62 = vperm2f128_avx(auVar71,auVar62,0x31);
              auVar4 = vperm2f128_avx(auVar4,auVar66,0x31);
              BT->data = (void *)SUB168(auVar7._0_16_,0);
              BT->refcount = (int *)SUB168(auVar7._0_16_,8);
              BT->elemsize = auVar63._0_8_;
              BT->elempack = auVar63._8_4_;
              *(int *)&BT->field_0x1c = auVar63._12_4_;
              BT->allocator = (Allocator *)auVar67._0_8_;
              BT->dims = auVar67._8_4_;
              BT->w = auVar67._12_4_;
              BT->h = auVar61._0_4_;
              BT->d = auVar61._4_4_;
              BT->c = auVar61._8_4_;
              *(int *)&BT->field_0x3c = auVar61._12_4_;
              *(undefined1 (*) [32])&BT->cstep = auVar73;
              BT[1].elempack = auVar72._0_4_;
              *(int *)&BT[1].field_0x1c = auVar72._4_4_;
              BT[1].allocator = (Allocator *)auVar72._8_8_;
              BT[1].dims = auVar65._0_4_;
              BT[1].w = auVar65._4_4_;
              BT[1].h = auVar65._8_4_;
              BT[1].d = auVar65._12_4_;
              *(undefined1 (*) [32])&BT[1].c = auVar59;
              BT[2].elemsize = auVar60._0_8_;
              BT[2].elempack = auVar60._8_4_;
              *(int *)&BT[2].field_0x1c = auVar60._12_4_;
              BT[2].allocator = (Allocator *)auVar60._16_8_;
              BT[2].dims = auVar60._24_4_;
              BT[2].w = auVar60._28_4_;
              *(undefined1 (*) [32])&BT[2].h = auVar6;
              BT[3].refcount = (int *)auVar3._0_8_;
              BT[3].elemsize = auVar3._8_8_;
              BT[3].elempack = auVar3._16_4_;
              *(int *)&BT[3].field_0x1c = auVar3._20_4_;
              BT[3].allocator = (Allocator *)auVar3._24_8_;
              BT[3].dims = auVar64._0_4_;
              BT[3].w = auVar64._4_4_;
              BT[3].h = auVar64._8_4_;
              BT[3].d = auVar64._12_4_;
              BT[3].c = auVar64._16_4_;
              *(int *)&BT[3].field_0x3c = auVar64._20_4_;
              BT[3].cstep = auVar64._24_8_;
              BT[4].data = (void *)auVar5._0_8_;
              BT[4].refcount = (int *)auVar5._8_8_;
              BT[4].elemsize = auVar5._16_8_;
              BT[4].elempack = auVar5._24_4_;
              *(int *)&BT[4].field_0x1c = auVar5._28_4_;
              BT[4].allocator = (Allocator *)auVar62._0_8_;
              BT[4].dims = auVar62._8_4_;
              BT[4].w = auVar62._12_4_;
              BT[4].h = auVar62._16_4_;
              BT[4].d = auVar62._20_4_;
              BT[4].c = auVar62._24_4_;
              *(int *)&BT[4].field_0x3c = auVar62._28_4_;
              *(undefined1 (*) [32])&BT[4].cstep = auVar4;
              BT = (Mat *)&BT[5].elempack;
              lVar37 = lVar37 + 0x20;
              iVar46 = iVar46 + 8;
            } while (iVar46 < max_kk);
            local_d8 = lVar37 + lVar28;
            lVar48 = lVar37 + lVar44 + (lVar36 + 1) * lVar38 * 4;
            lVar43 = lVar37 + lVar44 + (lVar36 + 2) * lVar38 * 4;
            lVar42 = lVar37 + lVar44 + (lVar36 + 3) * lVar38 * 4;
            lVar39 = lVar37 + lVar44 + lVar41 * 4;
            local_108 = lVar37 + lVar44 + (lVar36 + 5) * lVar38 * 4;
            local_110 = lVar37 + lVar44 + (lVar36 + 6) * lVar38 * 4;
            local_e0 = lVar44 + (lVar36 + 7) * lVar38 * 4 + lVar37;
            lVar57 = lVar37 + lVar44 + lVar47 * 4;
            lVar58 = lVar37 + lVar44 + (lVar36 + 9) * lVar38 * 4;
            local_158 = lVar37 + lVar44 + (lVar36 + 10) * lVar38 * 4;
            lVar37 = lVar37 + lVar44 + (lVar36 + 0xb) * lVar38 * 4;
            uVar45 = max_kk & 0xfffffff8;
          }
          if ((int)(uVar45 | 3) < max_kk) {
            lVar51 = 0;
            uVar34 = uVar45;
            do {
              auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(local_d8 + lVar51),
                                      *(undefined1 (*) [16])(lVar48 + lVar51));
              auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(lVar43 + lVar51),
                                      *(undefined1 (*) [16])(lVar42 + lVar51));
              auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(local_d8 + lVar51),
                                      *(undefined1 (*) [16])(lVar48 + lVar51));
              auVar65 = vunpckhps_avx(*(undefined1 (*) [16])(lVar43 + lVar51),
                                      *(undefined1 (*) [16])(lVar42 + lVar51));
              auVar12 = vunpcklpd_avx(auVar61,auVar67);
              auVar61 = vunpckhpd_avx(auVar61,auVar67);
              auVar13 = vunpcklpd_avx(auVar63,auVar65);
              auVar63 = vunpckhpd_avx(auVar63,auVar65);
              auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(lVar39 + lVar51),
                                      *(undefined1 (*) [16])(local_108 + lVar51));
              auVar17 = vunpcklps_avx(*(undefined1 (*) [16])(local_110 + lVar51),
                                      *(undefined1 (*) [16])(local_e0 + lVar51));
              auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(lVar39 + lVar51),
                                      *(undefined1 (*) [16])(local_108 + lVar51));
              auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(local_110 + lVar51),
                                      *(undefined1 (*) [16])(local_e0 + lVar51));
              auVar14 = vunpcklpd_avx(auVar65,auVar17);
              auVar65 = vunpckhpd_avx(auVar65,auVar17);
              auVar15 = vunpcklpd_avx(auVar67,auVar72);
              auVar67 = vunpckhpd_avx(auVar67,auVar72);
              auVar72 = vunpcklps_avx(*(undefined1 (*) [16])(lVar57 + lVar51),
                                      *(undefined1 (*) [16])(lVar58 + lVar51));
              auVar18 = vunpcklps_avx(*(undefined1 (*) [16])(local_158 + lVar51),
                                      *(undefined1 (*) [16])(lVar37 + lVar51));
              auVar17 = vunpckhps_avx(*(undefined1 (*) [16])(lVar57 + lVar51),
                                      *(undefined1 (*) [16])(lVar58 + lVar51));
              auVar11 = vunpckhps_avx(*(undefined1 (*) [16])(local_158 + lVar51),
                                      *(undefined1 (*) [16])(lVar37 + lVar51));
              auVar16 = vunpcklpd_avx(auVar72,auVar18);
              auVar72 = vunpckhpd_avx(auVar72,auVar18);
              auVar18 = vunpcklpd_avx(auVar17,auVar11);
              auVar17 = vunpckhpd_avx(auVar17,auVar11);
              BT->data = (void *)auVar12._0_8_;
              BT->refcount = (int *)auVar12._8_8_;
              BT->elemsize = auVar14._0_8_;
              BT->elempack = auVar14._8_4_;
              *(int *)&BT->field_0x1c = auVar14._12_4_;
              BT->allocator = (Allocator *)auVar16._0_8_;
              BT->dims = auVar16._8_4_;
              BT->w = auVar16._12_4_;
              BT->h = auVar61._0_4_;
              BT->d = auVar61._4_4_;
              BT->c = auVar61._8_4_;
              *(int *)&BT->field_0x3c = auVar61._12_4_;
              *(undefined1 (*) [16])&BT->cstep = auVar65;
              BT[1].refcount = (int *)auVar72._0_8_;
              BT[1].elemsize = auVar72._8_8_;
              BT[1].elempack = auVar13._0_4_;
              *(int *)&BT[1].field_0x1c = auVar13._4_4_;
              BT[1].allocator = (Allocator *)auVar13._8_8_;
              BT[1].dims = auVar15._0_4_;
              BT[1].w = auVar15._4_4_;
              BT[1].h = auVar15._8_4_;
              BT[1].d = auVar15._12_4_;
              BT[1].c = auVar18._0_4_;
              *(int *)&BT[1].field_0x3c = auVar18._4_4_;
              BT[1].cstep = auVar18._8_8_;
              BT[2].data = (void *)auVar63._0_8_;
              BT[2].refcount = (int *)auVar63._8_8_;
              BT[2].elemsize = auVar67._0_8_;
              BT[2].elempack = auVar67._8_4_;
              *(int *)&BT[2].field_0x1c = auVar67._12_4_;
              BT[2].allocator = (Allocator *)auVar17._0_8_;
              BT[2].dims = auVar17._8_4_;
              BT[2].w = auVar17._12_4_;
              BT = (Mat *)&BT[2].h;
              uVar45 = uVar34 + 4;
              lVar51 = lVar51 + 0x10;
              iVar46 = uVar34 + 7;
              uVar34 = uVar45;
            } while (iVar46 < max_kk);
            local_d8 = local_d8 + lVar51;
            lVar48 = lVar48 + lVar51;
            lVar43 = lVar43 + lVar51;
            lVar42 = lVar42 + lVar51;
            lVar39 = lVar39 + lVar51;
            local_108 = local_108 + lVar51;
            local_110 = local_110 + lVar51;
            local_e0 = local_e0 + lVar51;
            lVar57 = lVar57 + lVar51;
            lVar58 = lVar58 + lVar51;
            local_158 = local_158 + lVar51;
            lVar37 = lVar37 + lVar51;
          }
          if ((int)uVar45 < max_kk) {
            lVar51 = 0;
            do {
              *(int *)&BT->data = *(int *)(local_d8 + lVar51 * 4);
              *(int *)((long)&BT->data + 4) = *(int *)(lVar48 + lVar51 * 4);
              *(int *)&BT->refcount = *(int *)(lVar43 + lVar51 * 4);
              *(undefined4 *)((long)&BT->refcount + 4) = *(undefined4 *)(lVar42 + lVar51 * 4);
              *(undefined4 *)&BT->elemsize = *(undefined4 *)(lVar39 + lVar51 * 4);
              *(undefined4 *)((long)&BT->elemsize + 4) = *(undefined4 *)(local_108 + lVar51 * 4);
              BT->elempack = *(int *)(local_110 + lVar51 * 4);
              *(undefined4 *)&BT->field_0x1c = *(undefined4 *)(local_e0 + lVar51 * 4);
              *(undefined4 *)&BT->allocator = *(undefined4 *)(lVar57 + lVar51 * 4);
              *(undefined4 *)((long)&BT->allocator + 4) = *(undefined4 *)(lVar58 + lVar51 * 4);
              BT->dims = *(int *)(local_158 + lVar51 * 4);
              BT->w = *(int *)(lVar37 + lVar51 * 4);
              BT = (Mat *)&BT->h;
              lVar51 = lVar51 + 1;
            } while (max_kk - uVar45 != (int)lVar51);
          }
        }
      }
      lVar48 = lVar33 + 0xc;
      uVar49 = lVar33 + 0x17;
      lVar56 = lVar56 + lVar53;
      lVar54 = lVar54 + lVar53;
      lVar25 = lVar25 + lVar53;
      local_f0 = local_f0 + lVar53;
      lVar33 = lVar48;
    } while (uVar49 < (uint)max_jj);
  }
  lVar56 = (long)max_jj;
  if ((int)lVar48 + 7 < max_jj) {
    lVar28 = (long)(int)lVar48;
    lVar44 = (lVar28 + lVar36 + 4) * lVar38;
    lVar25 = (long)(k * 4) * 4;
    lVar54 = lVar25 + lVar44 * 4;
    lVar48 = (lVar28 + lVar36) * lVar38;
    lVar25 = lVar25 + lVar48 * 4;
    local_b0 = lVar55 * 4;
    local_130 = local_b0 + (lVar28 + lVar36 + 7) * lVar38 * 4;
    local_138 = local_b0 + (lVar28 + lVar36 + 6) * lVar38 * 4;
    local_f0 = local_b0 + (lVar28 + lVar36 + 5) * lVar38 * 4;
    local_f8 = local_b0 + lVar44 * 4;
    local_c8 = local_b0 + (lVar28 + lVar36 + 3) * lVar38 * 4;
    local_d0 = local_b0 + (lVar28 + lVar36 + 2) * lVar38 * 4;
    local_100 = local_b0 + (lVar28 + lVar36 + 1) * lVar38 * 4;
    local_b0 = local_b0 + lVar48 * 4;
    lVar44 = lVar38 * 0x20;
    do {
      iVar46 = (int)lVar28;
      if (iVar40 == 0x10) {
        pvVar27 = B->data;
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 0xf + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        uVar45 = uVar45 & 0xfffffff0;
        pauVar29 = (undefined1 (*) [32])
                   ((long)pvVar27 + (long)(k << 4) * 4 + (long)(int)(uVar45 * iVar9) * 4);
        iVar35 = uVar34 - uVar45;
        iVar50 = max_kk;
        if (uVar34 == uVar45 && 0 < max_kk) {
          do {
            *(undefined1 (*) [32])BT = *pauVar29;
            BT = (Mat *)&BT->allocator;
            pauVar29 = pauVar29 + 2;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar50 = max_kk;
        if (iVar35 == 4 && 0 < max_kk) {
          do {
            *(undefined1 (*) [32])BT = *(undefined1 (*) [32])(*pauVar29 + 0x10);
            BT = (Mat *)&BT->allocator;
            pauVar29 = pauVar29 + 2;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar50 = max_kk;
        if (iVar35 == 8 && 0 < max_kk) {
          do {
            *(undefined1 (*) [32])BT = pauVar29[1];
            BT = (Mat *)&BT->allocator;
            pauVar29 = pauVar29 + 2;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        if (iVar35 == 0xc && 0 < max_kk) {
          lVar48 = 0;
          iVar50 = max_kk;
          do {
            lVar30 = lVar48;
            uVar21 = *(undefined8 *)((long)(pauVar29[1] + lVar30 * 2 + 0x10) + 8);
            puVar26 = (undefined8 *)((long)&BT->data + lVar30);
            *puVar26 = *(undefined8 *)(pauVar29[1] + lVar30 * 2 + 0x10);
            puVar26[1] = uVar21;
            *(undefined1 (*) [16])((long)&BT->elemsize + lVar30) =
                 *(undefined1 (*) [16])
                  ((long)pvVar27 +
                  lVar30 * 2 + (long)(k << 4) * 4 + (long)(int)((uVar45 + 0x10) * iVar9) * 4);
            iVar50 = iVar50 + -1;
            lVar48 = lVar30 + 0x20;
          } while (iVar50 != 0);
          BT = (Mat *)((long)&BT->allocator + lVar30);
        }
      }
      if (iVar40 == 8) {
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 7 + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        pvVar27 = B->data;
        pauVar29 = (undefined1 (*) [32])
                   ((long)pvVar27 + (long)(k * 8) * 4 + (long)(((int)uVar45 >> 3) * iVar9 * 8) * 4);
        iVar50 = iVar46 + j + 8;
        iVar46 = j + iVar46 + 0xf;
        if (-1 < iVar50) {
          iVar46 = iVar50;
        }
        iVar50 = max_kk;
        if (uVar34 == (uVar45 & 0xfffffff8) && 0 < max_kk) {
          do {
            *(undefined1 (*) [32])BT = *pauVar29;
            BT = (Mat *)&BT->allocator;
            pauVar29 = pauVar29 + 1;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        if (uVar34 - (uVar45 & 0xfffffff8) == 4 && 0 < max_kk) {
          lVar48 = 0;
          iVar50 = max_kk;
          do {
            lVar30 = lVar48;
            uVar21 = *(undefined8 *)((long)(*pauVar29 + lVar30 + 0x10) + 8);
            puVar26 = (undefined8 *)((long)&BT->data + lVar30);
            *puVar26 = *(undefined8 *)(*pauVar29 + lVar30 + 0x10);
            puVar26[1] = uVar21;
            *(undefined1 (*) [16])((long)&BT->elemsize + lVar30) =
                 *(undefined1 (*) [16])
                  ((long)pvVar27 +
                  lVar30 + (long)(k * 8) * 4 + (long)((iVar46 >> 3) * iVar9 * 8) * 4);
            iVar50 = iVar50 + -1;
            lVar48 = lVar30 + 0x20;
          } while (iVar50 != 0);
          BT = (Mat *)((long)&BT->allocator + lVar30);
        }
      }
      if (iVar40 == 4) {
        if (0 < max_kk) {
          pvVar27 = B->data;
          iVar46 = max_kk;
          do {
            piVar19 = (int *)((undefined8 *)((long)pvVar27 + lVar25))[1];
            BT->data = *(void **)((long)pvVar27 + lVar25);
            BT->refcount = piVar19;
            *(undefined1 (*) [16])&BT->elemsize = *(undefined1 (*) [16])((long)pvVar27 + lVar54);
            BT = (Mat *)&BT->allocator;
            pvVar27 = (void *)((long)pvVar27 + 0x10);
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
          goto LAB_004accd7;
        }
      }
      else {
LAB_004accd7:
        if (iVar40 == 1) {
          pvVar27 = B->data;
          if (max_kk < 8) {
            uVar45 = 0;
            lVar48 = lVar55 * 4 + (lVar28 + lVar36) * lVar38 * 4;
            lVar42 = lVar55 * 4 + (lVar28 + lVar36 + 1) * lVar38 * 4;
            lVar43 = lVar55 * 4 + (lVar28 + lVar36 + 2) * lVar38 * 4;
            lVar47 = lVar55 * 4 + (lVar28 + lVar36 + 3) * lVar38 * 4;
            lVar41 = lVar55 * 4 + (lVar28 + lVar36 + 4) * lVar38 * 4;
            lVar33 = lVar55 * 4 + (lVar28 + lVar36 + 5) * lVar38 * 4;
            lVar53 = lVar55 * 4 + (lVar28 + lVar36 + 6) * lVar38 * 4;
            lVar30 = lVar55 * 4 + (lVar28 + lVar36 + 7) * lVar38 * 4;
          }
          else {
            iVar46 = 7;
            lVar48 = 0;
            pMVar23 = BT;
            do {
              pMVar32 = pMVar23;
              ppvVar1 = &BT->data + lVar48;
              lVar30 = lVar48 + local_b0;
              auVar3 = *(undefined1 (*) [32])((long)pvVar27 + lVar48 + local_b0);
              lVar53 = lVar38 * 8 + lVar30;
              auVar62 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 4 + lVar30);
              auVar64 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 8 + lVar30);
              auVar4 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 4 + lVar53);
              lVar30 = lVar38 * 8 + lVar53;
              auVar5 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 8 + lVar53);
              lVar53 = lVar38 * 4 + lVar30;
              auVar66 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 4 + lVar30);
              auVar6 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 4 + lVar53);
              auVar7 = *(undefined1 (*) [32])((long)pvVar27 + lVar38 * 8 + lVar53);
              auVar8 = vunpcklps_avx(auVar3,auVar62);
              auVar62 = vunpckhps_avx(auVar3,auVar62);
              auVar3 = vunpcklps_avx(auVar64,auVar4);
              auVar64 = vunpckhps_avx(auVar64,auVar4);
              auVar68 = vunpcklps_avx(auVar5,auVar66);
              auVar4 = vunpckhps_avx(auVar5,auVar66);
              auVar69 = vunpcklps_avx(auVar6,auVar7);
              auVar5 = vunpckhps_avx(auVar6,auVar7);
              auVar66 = vunpcklpd_avx(auVar8,auVar3);
              auVar3 = vunpckhpd_avx(auVar8,auVar3);
              auVar6 = vunpcklpd_avx(auVar62,auVar64);
              auVar62 = vunpckhpd_avx(auVar62,auVar64);
              auVar7 = vunpcklpd_avx(auVar68,auVar69);
              auVar64 = vunpckhpd_avx(auVar68,auVar69);
              auVar8 = vunpcklpd_avx(auVar4,auVar5);
              auVar4 = vunpckhpd_avx(auVar4,auVar5);
              auVar68._16_16_ = auVar7._0_16_;
              auVar68._0_16_ = auVar66._0_16_;
              auVar69._16_16_ = auVar64._0_16_;
              auVar69._0_16_ = auVar3._0_16_;
              auVar70._16_16_ = auVar8._0_16_;
              auVar70._0_16_ = auVar6._0_16_;
              auVar71._16_16_ = auVar4._0_16_;
              auVar71._0_16_ = auVar62._0_16_;
              auVar5 = vperm2f128_avx(auVar66,auVar7,0x31);
              auVar3 = vperm2f128_avx(auVar3,auVar64,0x31);
              auVar64 = vperm2f128_avx(auVar6,auVar8,0x31);
              auVar62 = vperm2f128_avx(auVar62,auVar4,0x31);
              *(undefined1 (*) [32])ppvVar1 = auVar68;
              *(undefined1 (*) [32])(ppvVar1 + 4) = auVar69;
              *(undefined1 (*) [32])(ppvVar1 + 8) = auVar70;
              *(undefined1 (*) [32])(ppvVar1 + 0xc) = auVar71;
              *(undefined1 (*) [32])(ppvVar1 + 0x10) = auVar5;
              *(undefined1 (*) [32])(ppvVar1 + 0x14) = auVar3;
              *(undefined1 (*) [32])(ppvVar1 + 0x18) = auVar64;
              *(undefined1 (*) [32])(ppvVar1 + 0x1c) = auVar62;
              lVar48 = lVar48 + 0x20;
              iVar46 = iVar46 + 8;
              pMVar23 = (Mat *)(ppvVar1 + 0x20);
            } while (iVar46 < max_kk);
            BT = (Mat *)&pMVar32[3].dims;
            lVar30 = lVar48 + local_130;
            lVar53 = lVar48 + local_138;
            lVar33 = lVar48 + local_f0;
            lVar41 = lVar48 + local_f8;
            lVar47 = lVar48 + local_c8;
            lVar43 = lVar48 + local_d0;
            lVar42 = lVar48 + local_100;
            lVar48 = lVar48 + local_b0;
            uVar45 = max_kk & 0xfffffff8;
          }
          lVar41 = (long)pvVar27 + lVar41;
          lVar53 = (long)pvVar27 + lVar53;
          lVar42 = (long)pvVar27 + lVar42;
          lVar48 = (long)pvVar27 + lVar48;
          lVar47 = (long)pvVar27 + lVar47;
          lVar43 = (long)pvVar27 + lVar43;
          lVar33 = (long)pvVar27 + lVar33;
          lVar30 = (long)pvVar27 + lVar30;
          if ((int)(uVar45 | 3) < max_kk) {
            lVar57 = 0;
            lVar39 = 0;
            uVar34 = uVar45;
            do {
              lVar58 = lVar39;
              auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(lVar48 + lVar57),
                                      *(undefined1 (*) [16])(lVar42 + lVar57));
              auVar67 = vunpcklps_avx(*(undefined1 (*) [16])(lVar43 + lVar57),
                                      *(undefined1 (*) [16])(lVar47 + lVar57));
              auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(lVar48 + lVar57),
                                      *(undefined1 (*) [16])(lVar42 + lVar57));
              auVar65 = vunpckhps_avx(*(undefined1 (*) [16])(lVar43 + lVar57),
                                      *(undefined1 (*) [16])(lVar47 + lVar57));
              auVar17 = vunpcklpd_avx(auVar61,auVar67);
              auVar61 = vunpckhpd_avx(auVar61,auVar67);
              auVar11 = vunpcklpd_avx(auVar63,auVar65);
              auVar63 = vunpckhpd_avx(auVar63,auVar65);
              auVar65 = vunpcklps_avx(*(undefined1 (*) [16])(lVar41 + lVar57),
                                      *(undefined1 (*) [16])(lVar33 + lVar57));
              auVar13 = vunpcklps_avx(*(undefined1 (*) [16])(lVar53 + lVar57),
                                      *(undefined1 (*) [16])(lVar30 + lVar57));
              auVar67 = vunpckhps_avx(*(undefined1 (*) [16])(lVar41 + lVar57),
                                      *(undefined1 (*) [16])(lVar33 + lVar57));
              auVar72 = vunpckhps_avx(*(undefined1 (*) [16])(lVar53 + lVar57),
                                      *(undefined1 (*) [16])(lVar30 + lVar57));
              auVar12 = vunpcklpd_avx(auVar65,auVar13);
              auVar65 = vunpckhpd_avx(auVar65,auVar13);
              auVar13 = vunpcklpd_avx(auVar67,auVar72);
              auVar67 = vunpckhpd_avx(auVar67,auVar72);
              *(undefined1 (*) [16])(&BT->data + lVar57) = auVar17;
              *(undefined1 (*) [16])(&BT->elemsize + lVar57) = auVar12;
              *(undefined1 (*) [16])(&BT->allocator + lVar57) = auVar61;
              *(undefined1 (*) [16])(&BT->h + lVar57 * 2) = auVar65;
              *(undefined1 (*) [16])(&BT->cstep + lVar57) = auVar11;
              *(undefined1 (*) [16])(&BT[1].refcount + lVar57) = auVar13;
              *(undefined1 (*) [16])(&BT[1].elempack + lVar57 * 2) = auVar63;
              *(undefined1 (*) [16])(&BT[1].dims + lVar57 * 2) = auVar67;
              uVar45 = uVar34 + 4;
              lVar57 = lVar57 + 0x10;
              iVar46 = uVar34 + 7;
              lVar39 = lVar58 + 0x80;
              uVar34 = uVar45;
            } while (iVar46 < max_kk);
            BT = (Mat *)((long)&BT[1].c + lVar58);
            lVar30 = lVar30 + lVar57;
            lVar53 = lVar53 + lVar57;
            lVar33 = lVar33 + lVar57;
            lVar41 = lVar41 + lVar57;
            lVar47 = lVar47 + lVar57;
            lVar43 = lVar43 + lVar57;
            lVar42 = lVar42 + lVar57;
            lVar48 = lVar48 + lVar57;
          }
          iVar46 = max_kk - uVar45;
          if (iVar46 != 0 && (int)uVar45 <= max_kk) {
            lVar39 = 0;
            lVar57 = 0;
            do {
              *(undefined4 *)(&BT->data + lVar57) = *(undefined4 *)(lVar48 + lVar57);
              *(undefined4 *)((long)&BT->data + lVar57 * 8 + 4) = *(undefined4 *)(lVar42 + lVar57);
              *(undefined4 *)(&BT->refcount + lVar57) = *(undefined4 *)(lVar43 + lVar57);
              *(undefined4 *)((long)&BT->refcount + lVar57 * 8 + 4) =
                   *(undefined4 *)(lVar47 + lVar57);
              *(undefined4 *)(&BT->elemsize + lVar57) = *(undefined4 *)(lVar41 + lVar57);
              *(undefined4 *)((long)&BT->elemsize + lVar57 * 8 + 4) =
                   *(undefined4 *)(lVar33 + lVar57);
              (&BT->elempack)[lVar57 * 2] = *(int *)(lVar53 + lVar57);
              *(undefined4 *)(&BT->field_0x1c + lVar57 * 8) = *(undefined4 *)(lVar30 + lVar57);
              lVar57 = lVar57 + 4;
              lVar39 = lVar39 + -0x20;
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
            BT = (Mat *)((long)BT - lVar39);
          }
        }
      }
      lVar48 = lVar28 + 8;
      lVar54 = lVar54 + lVar44;
      lVar25 = lVar25 + lVar44;
      local_130 = local_130 + lVar44;
      local_138 = local_138 + lVar44;
      local_f0 = local_f0 + lVar44;
      local_f8 = local_f8 + lVar44;
      local_c8 = local_c8 + lVar44;
      local_d0 = local_d0 + lVar44;
      local_100 = local_100 + lVar44;
      local_b0 = local_b0 + lVar44;
      bVar10 = lVar28 < lVar56 + -0xf;
      lVar28 = lVar48;
    } while (bVar10);
  }
  if ((int)((uint)lVar48 | 3) < max_jj) {
    lVar30 = (long)(int)(uint)lVar48;
    lVar44 = lVar55 * 4;
    lVar54 = lVar44 + (lVar30 + lVar36 + 3) * lVar38 * 4;
    lVar53 = lVar38 * 0x10;
    lVar25 = lVar44 + (lVar30 + lVar36 + 2) * lVar38 * 4;
    lVar28 = lVar44 + (lVar30 + lVar36 + 1) * lVar38 * 4;
    lVar44 = lVar44 + (lVar30 + lVar36) * lVar38 * 4;
    do {
      iVar46 = (int)lVar30;
      if (iVar40 == 0x10) {
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 0xf + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        pauVar31 = (undefined1 (*) [16])
                   ((long)B->data +
                   (long)(k << 4) * 4 + (long)(((int)uVar45 >> 4) * iVar9 * 0x10) * 4);
        iVar35 = uVar34 - (uVar45 & 0xfffffff0);
        iVar50 = max_kk;
        if (uVar34 == (uVar45 & 0xfffffff0) && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 4;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar50 = max_kk;
        if (iVar35 == 4 && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])BT = pauVar31[1];
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 4;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        iVar50 = max_kk;
        if (iVar35 == 8 && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])BT = pauVar31[2];
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 4;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
        if (iVar35 == 0xc && 0 < max_kk) {
          pauVar31 = pauVar31 + 3;
          iVar50 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 4;
            iVar50 = iVar50 + -1;
          } while (iVar50 != 0);
        }
      }
      if (iVar40 == 8) {
        uVar34 = iVar46 + j;
        uVar45 = iVar46 + 7 + j;
        if (-1 < (int)uVar34) {
          uVar45 = uVar34;
        }
        pauVar31 = (undefined1 (*) [16])
                   ((long)B->data + (long)(k * 8) * 4 + (long)(((int)uVar45 >> 3) * iVar9 * 8) * 4);
        iVar46 = max_kk;
        if (uVar34 == (uVar45 & 0xfffffff8) && 0 < max_kk) {
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 2;
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
        }
        if (uVar34 - (uVar45 & 0xfffffff8) == 4 && 0 < max_kk) {
          pauVar31 = pauVar31 + 1;
          iVar46 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 2;
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
        }
      }
      if (iVar40 == 4) {
        if (0 < max_kk) {
          pauVar31 = (undefined1 (*) [16])
                     ((long)B->data + (long)(k * 4) * 4 + (lVar36 + lVar30) * lVar38 * 4);
          iVar46 = max_kk;
          do {
            *(undefined1 (*) [16])BT = *pauVar31;
            BT = (Mat *)&BT->elemsize;
            pauVar31 = pauVar31 + 1;
            iVar46 = iVar46 + -1;
          } while (iVar46 != 0);
          goto LAB_004ad3b7;
        }
      }
      else {
LAB_004ad3b7:
        if (iVar40 == 1) {
          pvVar27 = B->data;
          if (max_kk < 8) {
            uVar45 = 0;
            lVar47 = lVar55 * 4 + (lVar30 + lVar36) * lVar38 * 4;
            lVar41 = lVar55 * 4 + (lVar30 + lVar36 + 1) * lVar38 * 4;
            lVar33 = lVar55 * 4 + (lVar30 + lVar36 + 2) * lVar38 * 4;
            lVar48 = lVar55 * 4 + (lVar36 + lVar30 + 3) * lVar38 * 4;
          }
          else {
            iVar46 = 7;
            lVar47 = 0;
            pMVar23 = BT;
            do {
              pMVar32 = pMVar23;
              pauVar29 = (undefined1 (*) [32])((long)&BT->data + lVar47 * 4);
              auVar3 = *(undefined1 (*) [32])((long)pvVar27 + lVar47 + lVar44);
              auVar62 = *(undefined1 (*) [32])((long)pvVar27 + lVar47 + lVar28);
              auVar64 = *(undefined1 (*) [32])((long)pvVar27 + lVar47 + lVar25);
              auVar4 = *(undefined1 (*) [32])((long)pvVar27 + lVar47 + lVar54);
              auVar5 = vunpcklps_avx(auVar3,auVar62);
              auVar62 = vunpckhps_avx(auVar3,auVar62);
              auVar3 = vunpcklps_avx(auVar64,auVar4);
              auVar64 = vunpckhps_avx(auVar64,auVar4);
              auVar4 = vunpcklpd_avx(auVar5,auVar3);
              auVar3 = vunpckhpd_avx(auVar5,auVar3);
              auVar5 = vunpcklpd_avx(auVar62,auVar64);
              auVar62 = vunpckhpd_avx(auVar62,auVar64);
              auVar64._16_16_ = auVar3._0_16_;
              auVar64._0_16_ = auVar4._0_16_;
              auVar66._16_16_ = auVar62._0_16_;
              auVar66._0_16_ = auVar5._0_16_;
              auVar3 = vperm2f128_avx(auVar4,auVar3,0x31);
              auVar62 = vperm2f128_avx(auVar5,auVar62,0x31);
              *pauVar29 = auVar64;
              pauVar29[1] = auVar66;
              pauVar29[2] = auVar3;
              pauVar29[3] = auVar62;
              lVar47 = lVar47 + 0x20;
              iVar46 = iVar46 + 8;
              pMVar23 = (Mat *)(pauVar29 + 4);
            } while (iVar46 < max_kk);
            BT = (Mat *)&pMVar32[1].c;
            lVar48 = lVar47 + lVar54;
            lVar33 = lVar47 + lVar25;
            lVar41 = lVar47 + lVar28;
            lVar47 = lVar47 + lVar44;
            uVar45 = max_kk & 0xfffffff8;
          }
          lVar33 = (long)pvVar27 + lVar33;
          lVar47 = (long)pvVar27 + lVar47;
          lVar48 = (long)pvVar27 + lVar48;
          lVar41 = (long)pvVar27 + lVar41;
          if ((int)(uVar45 | 3) < max_kk) {
            lVar43 = 0;
            pMVar23 = BT;
            uVar34 = uVar45;
            do {
              pMVar32 = pMVar23;
              auVar61 = vunpcklps_avx(*(undefined1 (*) [16])(lVar47 + lVar43),
                                      *(undefined1 (*) [16])(lVar41 + lVar43));
              auVar72 = vunpcklps_avx(*(undefined1 (*) [16])(lVar33 + lVar43),
                                      *(undefined1 (*) [16])(lVar48 + lVar43));
              auVar63 = vunpckhps_avx(*(undefined1 (*) [16])(lVar47 + lVar43),
                                      *(undefined1 (*) [16])(lVar41 + lVar43));
              auVar65 = vunpckhps_avx(*(undefined1 (*) [16])(lVar33 + lVar43),
                                      *(undefined1 (*) [16])(lVar48 + lVar43));
              auVar67 = vunpcklpd_avx(auVar61,auVar72);
              auVar61 = vunpckhpd_avx(auVar61,auVar72);
              auVar72 = vunpcklpd_avx(auVar63,auVar65);
              auVar63 = vunpckhpd_avx(auVar63,auVar65);
              pMVar23 = (Mat *)((long)&BT->cstep + lVar43 * 4);
              pMVar23[-1].refcount = (int *)auVar67._0_8_;
              pMVar23[-1].elemsize = auVar67._8_8_;
              pMVar23[-1].elempack = auVar61._0_4_;
              *(int *)&pMVar23[-1].field_0x1c = auVar61._4_4_;
              pMVar23[-1].allocator = (Allocator *)auVar61._8_8_;
              pMVar23[-1].dims = auVar72._0_4_;
              pMVar23[-1].w = auVar72._4_4_;
              pMVar23[-1].h = auVar72._8_4_;
              pMVar23[-1].d = auVar72._12_4_;
              pMVar23[-1].c = auVar63._0_4_;
              *(int *)&pMVar23[-1].field_0x3c = auVar63._4_4_;
              pMVar23[-1].cstep = auVar63._8_8_;
              uVar45 = uVar34 + 4;
              lVar43 = lVar43 + 0x10;
              iVar46 = uVar34 + 7;
              uVar34 = uVar45;
            } while (iVar46 < max_kk);
            BT = (Mat *)&pMVar32->cstep;
            lVar48 = lVar48 + lVar43;
            lVar33 = lVar33 + lVar43;
            lVar41 = lVar41 + lVar43;
            lVar47 = lVar47 + lVar43;
          }
          if ((int)uVar45 < max_kk) {
            lVar43 = 0;
            do {
              *(undefined4 *)&BT->data = *(undefined4 *)(lVar47 + lVar43 * 4);
              *(undefined4 *)((long)&BT->data + 4) = *(undefined4 *)(lVar41 + lVar43 * 4);
              *(undefined4 *)&BT->refcount = *(undefined4 *)(lVar33 + lVar43 * 4);
              *(undefined4 *)((long)&BT->refcount + 4) = *(undefined4 *)(lVar48 + lVar43 * 4);
              BT = (Mat *)&BT->elemsize;
              lVar43 = lVar43 + 1;
            } while (max_kk - uVar45 != (int)lVar43);
          }
        }
      }
      lVar48 = lVar30 + 4;
      lVar33 = lVar30 + 7;
      lVar54 = lVar54 + lVar53;
      lVar25 = lVar25 + lVar53;
      lVar28 = lVar28 + lVar53;
      lVar44 = lVar44 + lVar53;
      lVar30 = lVar48;
    } while (lVar33 < lVar56);
  }
  if ((int)((uint)lVar48 | 1) < max_jj) {
    lVar28 = (long)(int)(uint)lVar48;
    lVar54 = lVar55 * 4 + (lVar36 + lVar28 + 1) * lVar38 * 4;
    lVar25 = lVar55 * 4 + (lVar28 + lVar36) * lVar38 * 4;
    do {
      pvVar27 = B->data;
      if (max_kk < 8) {
        lVar44 = lVar55 * 4 + (lVar28 + lVar36) * lVar38 * 4;
        lVar48 = lVar55 * 4 + (lVar28 + lVar36 + 1) * lVar38 * 4;
        uVar45 = 0;
      }
      else {
        iVar40 = 7;
        lVar44 = 0;
        pMVar23 = BT;
        do {
          pMVar32 = pMVar23;
          auVar3 = *(undefined1 (*) [32])((long)pvVar27 + lVar44 + lVar25);
          auVar62 = *(undefined1 (*) [32])((long)pvVar27 + lVar44 + lVar54);
          auVar64 = vunpcklps_avx(auVar3,auVar62);
          auVar3 = vunpckhps_avx(auVar3,auVar62);
          auVar62._16_16_ = auVar3._0_16_;
          auVar62._0_16_ = auVar64._0_16_;
          auVar3 = vperm2f128_avx(auVar64,auVar3,0x31);
          pauVar29 = (undefined1 (*) [32])((long)&BT->data + lVar44 * 2);
          *pauVar29 = auVar62;
          pauVar29[1] = auVar3;
          lVar44 = lVar44 + 0x20;
          iVar40 = iVar40 + 8;
          pMVar23 = (Mat *)(pauVar29 + 2);
        } while (iVar40 < max_kk);
        BT = (Mat *)&pMVar32->cstep;
        lVar48 = lVar44 + lVar54;
        lVar44 = lVar44 + lVar25;
        uVar45 = max_kk & 0xfffffff8;
      }
      pauVar52 = (undefined1 (*) [16])((long)pvVar27 + lVar44);
      pauVar31 = (undefined1 (*) [16])((long)pvVar27 + lVar48);
      uVar34 = uVar45 | 3;
      while ((int)uVar34 < max_kk) {
        auVar63 = vunpcklps_avx(*pauVar52,*pauVar31);
        auVar61 = vunpckhps_avx(*pauVar52,*pauVar31);
        BT->data = (void *)auVar63._0_8_;
        BT->refcount = (int *)auVar63._8_8_;
        BT->elemsize = auVar61._0_8_;
        BT->elempack = auVar61._8_4_;
        *(int *)&BT->field_0x1c = auVar61._12_4_;
        BT = (Mat *)&BT->allocator;
        pauVar52 = pauVar52 + 1;
        pauVar31 = pauVar31 + 1;
        uVar34 = uVar45 + 7;
        uVar45 = uVar45 + 4;
      }
      if ((int)uVar45 < max_kk) {
        lVar48 = 0;
        do {
          *(undefined4 *)&BT->data = *(undefined4 *)(*pauVar52 + lVar48 * 4);
          *(undefined4 *)((long)&BT->data + 4) = *(undefined4 *)(*pauVar31 + lVar48 * 4);
          BT = (Mat *)&BT->refcount;
          lVar48 = lVar48 + 1;
        } while (max_kk - uVar45 != (int)lVar48);
      }
      lVar48 = lVar28 + 2;
      lVar44 = lVar28 + 3;
      lVar54 = lVar54 + lVar38 * 8;
      lVar25 = lVar25 + lVar38 * 8;
      lVar28 = lVar48;
    } while (lVar44 < lVar56);
  }
  if ((int)lVar48 < max_jj) {
    lVar48 = (long)(int)lVar48;
    do {
      puVar26 = (undefined8 *)((long)B->data + lVar55 * 4 + (lVar36 + lVar48) * lVar38 * 4);
      if (max_kk < 8) {
        uVar45 = 0;
      }
      else {
        iVar40 = 7;
        do {
          piVar19 = (int *)puVar26[1];
          sVar20 = puVar26[2];
          pAVar22 = (Allocator *)puVar26[3];
          BT->data = (int *)*puVar26;
          BT->refcount = piVar19;
          BT->elemsize = sVar20;
          *(Allocator **)&BT->elempack = pAVar22;
          BT = (Mat *)&BT->allocator;
          puVar26 = puVar26 + 4;
          iVar40 = iVar40 + 8;
          uVar45 = max_kk & 0xfffffff8;
        } while (iVar40 < max_kk);
      }
      uVar34 = uVar45 | 3;
      while ((int)uVar34 < max_kk) {
        piVar19 = (int *)puVar26[1];
        BT->data = (int *)*puVar26;
        BT->refcount = piVar19;
        BT = (Mat *)&BT->elemsize;
        puVar26 = puVar26 + 2;
        uVar34 = uVar45 + 7;
        uVar45 = uVar45 + 4;
      }
      if ((int)uVar45 < max_kk) {
        lVar54 = 0;
        lVar25 = 0;
        do {
          *(undefined4 *)((long)&BT->data + lVar25 * 4) =
               *(undefined4 *)((long)puVar26 + lVar25 * 4);
          lVar25 = lVar25 + 1;
          lVar54 = lVar54 + -4;
        } while (max_kk - uVar45 != (int)lVar25);
        BT = (Mat *)((long)BT - lVar54);
      }
      lVar48 = lVar48 + 1;
    } while (lVar48 != lVar56);
  }
  return;
}

Assistant:

static void pack_B_tile(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    const int elempack = B.elempack;
    const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

    float* pp = BT;

    int jj = 0;
#if __SSE2__
    for (; jj + 11 < max_jj; jj += 12)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 8));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    _mm_store_ps(pp + 8, _mm_load_ps(p0 + 12));
                    pp += 12;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + ((j + jj) / 8 * 8 + 8) * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    _mm_store_ps(pp + 8, _mm_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm256_storeu_ps(pp + 4, _mm256_load_ps(p1));
                    pp += 12;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;
            const float* p2 = (const float*)B + (j + jj + 8) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                pp += 12;
                p0 += 4;
                p1 += 4;
                p2 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;
            const float* p8 = (const float*)B + (j + jj + 8) * B_hstep + k;
            const float* p9 = (const float*)B + (j + jj + 9) * B_hstep + k;
            const float* pa = (const float*)B + (j + jj + 10) * B_hstep + k;
            const float* pb = (const float*)B + (j + jj + 11) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                __m256 _r8 = _mm256_loadu_ps(p8);
                __m256 _r9 = _mm256_loadu_ps(p9);
                __m256 _ra = _mm256_loadu_ps(pa);
                __m256 _rb = _mm256_loadu_ps(pb);
                transpose8x12_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                _mm256_storeu_ps(pp + 8 * 8, _r8);
                _mm256_storeu_ps(pp + 8 * 9, _r9);
                _mm256_storeu_ps(pp + 8 * 10, _ra);
                _mm256_storeu_ps(pp + 8 * 11, _rb);
                pp += 96;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
                p8 += 8;
                p9 += 8;
                pa += 8;
                pb += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                __m128 _r8 = _mm_loadu_ps(p8);
                __m128 _r9 = _mm_loadu_ps(p9);
                __m128 _ra = _mm_loadu_ps(pa);
                __m128 _rb = _mm_loadu_ps(pb);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _MM_TRANSPOSE4_PS(_r8, _r9, _ra, _rb);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r8);
                _mm_store_ps(pp + 4 * 3, _r1);
                _mm_store_ps(pp + 4 * 4, _r5);
                _mm_store_ps(pp + 4 * 5, _r9);
                _mm_store_ps(pp + 4 * 6, _r2);
                _mm_store_ps(pp + 4 * 7, _r6);
                _mm_store_ps(pp + 4 * 8, _ra);
                _mm_store_ps(pp + 4 * 9, _r3);
                _mm_store_ps(pp + 4 * 10, _r7);
                _mm_store_ps(pp + 4 * 11, _rb);
                pp += 48;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
                p8 += 4;
                p9 += 4;
                pa += 4;
                pb += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp += 12;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
            }
        }
    }
    for (; jj + 7 < max_jj; jj += 8)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;
            const float* p1 = (const float*)B + ((j + jj) / 16 * 16 + 16) * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_loadu_ps(p0 + 4));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0 + 8));
                    pp += 8;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 16;
                    p1 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;
            const float* p1 = (const float*)B + (j + jj + 8) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm256_storeu_ps(pp, _mm256_load_ps(p0));
                    pp += 8;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    _mm_store_ps(pp + 4, _mm_load_ps(p1));
                    pp += 8;
                    p0 += 8;
                    p1 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;
            const float* p1 = (const float*)B + (j + jj + 4) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;
            const float* p4 = (const float*)B + (j + jj + 4) * B_hstep + k;
            const float* p5 = (const float*)B + (j + jj + 5) * B_hstep + k;
            const float* p6 = (const float*)B + (j + jj + 6) * B_hstep + k;
            const float* p7 = (const float*)B + (j + jj + 7) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 8 * 2, _r2);
                _mm256_storeu_ps(pp + 8 * 3, _r3);
                _mm256_storeu_ps(pp + 8 * 4, _r4);
                _mm256_storeu_ps(pp + 8 * 5, _r5);
                _mm256_storeu_ps(pp + 8 * 6, _r6);
                _mm256_storeu_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                __m128 _r4 = _mm_loadu_ps(p4);
                __m128 _r5 = _mm_loadu_ps(p5);
                __m128 _r6 = _mm_loadu_ps(p6);
                __m128 _r7 = _mm_loadu_ps(p7);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r4);
                _mm_store_ps(pp + 4 * 2, _r1);
                _mm_store_ps(pp + 4 * 3, _r5);
                _mm_store_ps(pp + 4 * 4, _r2);
                _mm_store_ps(pp + 4 * 5, _r6);
                _mm_store_ps(pp + 4 * 6, _r3);
                _mm_store_ps(pp + 4 * 7, _r7);
                pp += 32;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
                p4 += 4;
                p5 += 4;
                p6 += 4;
                p7 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
    for (; jj + 3 < max_jj; jj += 4)
    {
#if __AVX__
#if __AVX512F__
        if (elempack == 16)
        {
            const float* p0 = (const float*)B + (j + jj) / 16 * 16 * B_hstep + k * 16;

            if ((j + jj) % 16 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 8)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 8));
                    pp += 4;
                    p0 += 16;
                }
            }
            if ((j + jj) % 16 == 12)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 12));
                    pp += 4;
                    p0 += 16;
                }
            }
        }
#endif // __AVX512F__
        if (elempack == 8)
        {
            const float* p0 = (const float*)B + (j + jj) / 8 * 8 * B_hstep + k * 8;

            if ((j + jj) % 8 == 0)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0));
                    pp += 4;
                    p0 += 8;
                }
            }
            if ((j + jj) % 8 == 4)
            {
                for (int kk = 0; kk < max_kk; kk++)
                {
                    _mm_store_ps(pp, _mm_load_ps(p0 + 4));
                    pp += 4;
                    p0 += 8;
                }
            }
        }
#endif // __AVX__
        if (elempack == 4)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;
            const float* p2 = (const float*)B + (j + jj + 2) * B_hstep + k;
            const float* p3 = (const float*)B + (j + jj + 3) * B_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                _mm256_storeu_ps(pp + 16, _r2);
                _mm256_storeu_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; jj + 1 < max_jj; jj += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;
            const float* p1 = (const float*)B + (j + jj + 1) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; jj < max_jj; jj += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)B + (j + jj) * B_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}